

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::updateGapIndicator(QMainWindowLayout *this)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  QWidget *p;
  QObject *this_00;
  undefined8 uVar4;
  int __sig;
  QRect *geom;
  QRubberBand *this_01;
  QAnyStringView QVar5;
  
  bVar3 = QWidgetAnimator::animating((QWidgetAnimator *)(this + 0x790));
  if ((!bVar3) &&
     ((*(long *)(this + 0x7c0) != 0 ||
      (((*(long *)(this + 0x7f0) != 0 && (*(int *)(*(long *)(this + 0x7f0) + 4) != 0)) &&
       (*(long *)(this + 0x7f8) != 0)))))) {
    lVar1 = *(long *)(this + 0x7f0);
    if (((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) || (*(long *)(this + 0x7f8) == 0)) {
      p = QLayout::parentWidget((QLayout *)this);
    }
    else if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
      p = (QWidget *)0x0;
    }
    else {
      p = *(QWidget **)(this + 0x7f8);
    }
    if (((*(long *)(this + 0x7e0) == 0) || (*(int *)(*(long *)(this + 0x7e0) + 4) == 0)) ||
       (*(long *)(this + 0x7e8) == 0)) {
      this_00 = (QObject *)operator_new(0x28);
      QRubberBand::QRubberBand((QRubberBand *)this_00,Rectangle,p);
      uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(this_00);
      piVar2 = *(int **)(this + 0x7e0);
      *(undefined8 *)(this + 0x7e0) = uVar4;
      *(QObject **)(this + 0x7e8) = this_00;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          operator_delete(piVar2);
        }
      }
      QVar5.m_size = (size_t)"qt_rubberband";
      QVar5.field_0.m_data =
           ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(this + 0x7e8))->m_data;
      QObject::setObjectName(QVar5);
    }
    else if (*(QWidget **)(*(long *)(*(long *)(this + 0x7e8) + 8) + 0x10) != p) {
      QWidget::setParent(*(QWidget **)(this + 0x7e8),p);
    }
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x7e8),0));
    if (((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) ||
       (*(long *)(this + 0x7f8) == 0)) {
      this_01 = *(QRubberBand **)(this + 0x7e8);
      geom = (QRect *)(this + 0x7c8);
    }
    else {
      this_01 = *(QRubberBand **)(this + 0x7e8);
      geom = (QRect *)(*(long *)(this + 0x7f8) + 0x28);
    }
    QRubberBand::setGeometry(this_01,geom);
    __sig = (int)geom;
    QWidget::show(*(QWidget **)(this + 0x7e8));
    QWidget::raise(*(QWidget **)(this + 0x7e8),__sig);
    QObject::blockSignals(SUB81(*(undefined8 *)(this + 0x7e8),0));
    return;
  }
  if (((*(long *)(this + 0x7e0) != 0) && (*(int *)(*(long *)(this + 0x7e0) + 4) != 0)) &&
     (*(long *)(this + 0x7e8) != 0)) {
    QWidget::hide(*(QWidget **)(this + 0x7e8));
    return;
  }
  return;
}

Assistant:

void QMainWindowLayout::updateGapIndicator()
{
#if QT_CONFIG(rubberband)
    if (!widgetAnimator.animating() && (!currentGapPos.isEmpty()
#if QT_CONFIG(dockwidget)
                                        || currentHoveredFloat
#endif
                                        )) {
        QWidget *expectedParent =
#if QT_CONFIG(dockwidget)
            currentHoveredFloat ? currentHoveredFloat.data() :
#endif
            parentWidget();
        if (!gapIndicator) {
            gapIndicator = new QRubberBand(QRubberBand::Rectangle, expectedParent);
            // For accessibility to identify this special widget.
            gapIndicator->setObjectName("qt_rubberband"_L1);
        } else if (gapIndicator->parent() != expectedParent) {
            gapIndicator->setParent(expectedParent);
        }

        // Prevent re-entry in case of size change
        const bool sigBlockState = gapIndicator->signalsBlocked();
        auto resetSignals = qScopeGuard([this, sigBlockState](){ gapIndicator->blockSignals(sigBlockState); });
        gapIndicator->blockSignals(true);

#if QT_CONFIG(dockwidget)
        if (currentHoveredFloat)
            gapIndicator->setGeometry(currentHoveredFloat->currentGapRect);
        else
#endif
            gapIndicator->setGeometry(currentGapRect);

        gapIndicator->show();
        gapIndicator->raise();

        // Reset signal state

    } else if (gapIndicator) {
        gapIndicator->hide();
    }

#endif // QT_CONFIG(rubberband)
}